

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t EqData(datatype Type,void *a,void *b,size_t Size)

{
  int iVar1;
  bool_t bVar2;
  ulong local_38;
  size_t i;
  size_t Size_local;
  void *b_local;
  void *a_local;
  datatype Type_local;
  
  b_local = a;
  switch(Type) {
  case 3:
    if ((a != (void *)0x0) && (b != (void *)0x0)) {
      bVar2 = EqFrac((cc_fraction *)a,(cc_fraction *)b);
      return bVar2;
    }
  default:
    if ((a == (void *)0x0) && (b == (void *)0x0)) {
      Type_local = 1;
    }
    else if ((a == (void *)0x0) || (b == (void *)0x0)) {
      if (a == (void *)0x0) {
        b_local = b;
      }
      for (local_38 = 0; local_38 < Size; local_38 = local_38 + 1) {
        if (*(char *)((long)b_local + local_38) != '\0') {
          return 0;
        }
      }
      Type_local = 1;
    }
    else {
      iVar1 = memcmp(a,b,Size);
      Type_local = (datatype)(int)(uint)(iVar1 == 0);
    }
    break;
  case 4:
  case 0x1f:
  case 0x20:
    if (a == (void *)0x0) {
      b_local = NullString;
    }
    Size_local = (size_t)b;
    if (b == (void *)0x0) {
      Size_local = (size_t)NullString;
    }
    iVar1 = tcscmp((tchar_t *)b_local,(tchar_t *)Size_local);
    Type_local = (datatype)(int)(uint)(iVar1 == 0);
    break;
  case 0x1e:
    Type_local = ArrayEq((array *)a,(array *)b);
  }
  return Type_local;
}

Assistant:

static NOINLINE bool_t EqData(datatype Type, const void* a, const void* b, size_t Size)
{
    size_t i;

    switch (Type)
    {
    case TYPE_EXPRSTRING:
    case TYPE_EXPRPARAM:
    case TYPE_STRING:
        if (!a) a = NullString;
        if (!b) b = NullString;
        return tcscmp(a,b)==0;

    case TYPE_ARRAY:
        return ArrayEq(a,b);

    case TYPE_FRACTION:
        if (a && b)
            return EqFrac((const cc_fraction*)a,(const cc_fraction*)b);
        break;
    }

    if (!a && !b)
        return 1;

    if (a && b)
        return memcmp(a,b,Size)==0;

    if (!a)
        a = b;

    for (i=0;i<Size;++i)
        if (((const uint8_t*)a)[i])
            return 0;

    return 1;
}